

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int lexan(void)

{
  char cVar1;
  ushort uVar2;
  __int32_t *p_Var3;
  ushort *puVar4;
  uint uVar5;
  int iVar6;
  __int32_t **pp_Var7;
  ushort **ppuVar8;
  __int32_t _Var9;
  ulong uVar10;
  char *pcVar11;
  bool bVar12;
  
  pp_Var7 = __ctype_toupper_loc();
  p_Var3 = *pp_Var7;
  pcVar11 = inputStr + 3;
  while( true ) {
    uVar5 = p_Var3[pcVar11[-3]];
    if ((0x20 < (ulong)uVar5) || ((0x100002600U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) break;
    pcVar11 = pcVar11 + 1;
  }
  inputStr = pcVar11 + -2;
  ppuVar8 = __ctype_b_loc();
  if (uVar5 != 0x2e) {
    puVar4 = *ppuVar8;
    if ((puVar4[(int)uVar5] & 0x800) == 0) {
      if (uVar5 == 0x57) {
        if ((((p_Var3[pcVar11[-2]] == 0x49) && (p_Var3[pcVar11[-1]] == 0x54)) &&
            (p_Var3[*pcVar11] == 0x48)) &&
           (((p_Var3[pcVar11[1]] == 0x49 && (p_Var3[pcVar11[2]] == 0x4e)) &&
            ((puVar4[pcVar11[3]] & 8) == 0)))) {
          inputStr = pcVar11 + 3;
          tokenval = 0;
          return 0x194;
        }
      }
      else if (((uVar5 == 0x4e) && (p_Var3[pcVar11[-2]] == 0x4f)) &&
              ((p_Var3[pcVar11[-1]] == 0x54 && ((puVar4[*pcVar11] & 8) == 0)))) {
        inputStr = pcVar11;
        tokenval = 0;
        return 400;
      }
      if ((puVar4[(int)uVar5] >> 10 & 1) != 0) {
        uVar10 = 1;
        lexbuf[0] = (char)uVar5;
        while ((((*ppuVar8)[*inputStr] & 8) != 0 ||
               ((uVar5 = (byte)*inputStr - 0x22, uVar5 < 0x3e &&
                ((0x2000000000000121U >> ((ulong)uVar5 & 0x3f) & 1) != 0))))) {
          if (0x62 < uVar10 - 1) {
            halt("symbol too long");
          }
          cVar1 = *inputStr;
          inputStr = inputStr + 1;
          lexbuf[uVar10] = (char)(*pp_Var7)[cVar1];
          uVar10 = uVar10 + 1;
        }
        lexbuf[uVar10 & 0xffffffff] = '\0';
        iVar6 = lookup(lexbuf);
        if (iVar6 == 0) {
          iVar6 = insert(lexbuf,0x193);
        }
        tokenval = iVar6;
        return 0x193;
      }
      if (uVar5 == 0) {
        tokenval = 0;
        return 0x195;
      }
      tokenval = 0;
      return uVar5;
    }
  }
  bVar12 = uVar5 == 0x2e;
  _Var9 = 0;
  uVar10 = 1;
  lexbuf[0] = (char)uVar5;
  while( true ) {
    cVar1 = *inputStr;
    uVar2 = (*ppuVar8)[cVar1];
    if (((uVar2 >> 0xb & 1) == 0) &&
       (((((uVar2 >> 10 & 1) == 0 && (cVar1 != '_')) && (cVar1 != '.')) || (_Var9 != 0 || bVar12))))
    break;
    if (cVar1 == '.') {
      bVar12 = true;
    }
    else if ((uVar2 >> 10 & 1) == 0) {
      if (cVar1 == '_') {
        _Var9 = 0x20;
      }
    }
    else {
      _Var9 = (*pp_Var7)[cVar1];
    }
    if (0x62 < uVar10 - 1) {
      halt("number too long");
    }
    cVar1 = *inputStr;
    inputStr = inputStr + 1;
    lexbuf[uVar10] = (char)(*pp_Var7)[cVar1];
    uVar10 = uVar10 + 1;
  }
  lexbuf[uVar10 & 0xffffffff] = '\0';
  if (bVar12) {
    realtokval = parseReal(lexbuf,0,(int)uVar10);
    tokenval = 0;
    iVar6 = 0x192;
  }
  else {
    tokenval = parseInteger(lexbuf,0,(int)uVar10);
    if (_Var9 != 0) {
      lexbuf[0] = (char)_Var9;
    }
    lexbuf[_Var9 != 0] = '\0';
    iVar6 = 0x191;
  }
  return iVar6;
}

Assistant:

int lexan() {
   int p, t, rc, cnt;
   
   for (;;) {
      t = toupper(*inputStr++);
      if (t == ' ' || t == '\t' || t == '\n' || t == '\r') {
	 /* skip over whitespace  */
      }
      else if (isdigit(t) || t == '.') {
	 int insCode = 0;
	 int fractional = (t == '.');
	 lexbuf[cnt = 0] = t;
	 while ( isdigit(*inputStr)
	    || (  (*inputStr == '.' ||
	            isalpha(*inputStr) || *inputStr == '_')
	      && ! (insCode || fractional)) ) {

	         if (*inputStr == '.')   { fractional = 1;               }
	    else if (isalpha(*inputStr)) { insCode = toupper(*inputStr); }
	    else if (*inputStr == '_')   { insCode = ' ';                }
	    if (cnt >= LXBUFSZ-1) { halt("number too long"); }
	    lexbuf[++cnt] = toupper(*inputStr++);
	 }
	 lexbuf[++cnt] = '\0';

	 if (fractional) {
	    realtokval = parseReal(lexbuf, 0, cnt);
	    tokenval = 0;
	    rc = REALNUM_TOK;
	 }
	 else { /* need to save insCode */
	    tokenval = parseInteger(lexbuf, 0, cnt);
            cnt = 0;
	    if (insCode) { lexbuf[cnt++] = insCode; }
	    lexbuf[cnt] = '\0';
	    rc = NUM_TOK;
	 }
	 break;
      }
      else if (t == 'N' && toupper(inputStr[0]) == 'O'
           && toupper(inputStr[1]) == 'T' && !isalnum(inputStr[2]) ) {
	 inputStr++;
	 inputStr++;
	 tokenval = 0;
	 rc = NOT_TOK;
	 break;
      }
      else if (t == 'W' && toupper(inputStr[0]) == 'I'
           && toupper(inputStr[1]) == 'T' && toupper(inputStr[2]) == 'H'
           && toupper(inputStr[3]) == 'I' && toupper(inputStr[4]) == 'N'
	   && !isalnum(inputStr[5]) ) {
	 inputStr += 5;
	 tokenval = 0;
	 rc = WITHIN_TOK;
	 break;
      }
      else if (isalpha(t)) {
	 lexbuf[cnt = 0] = t;
	 while (isalnum(*inputStr) || (*inputStr == '_')
	     || (*inputStr == '*') || (*inputStr == '\'')
	     || (*inputStr == '"')) {
	    if (cnt >= LXBUFSZ-1) { halt("symbol too long"); }
	    lexbuf[++cnt] = toupper(*inputStr++);
	 }
	 lexbuf[++cnt] = '\0';

	 p = lookup(lexbuf);
	 if (p == 0) {
	    p = insert(lexbuf, ID_TOK);
	 }
	 tokenval = p;
	 rc = ID_TOK;
	 break;
      }
      else if (t == '\0') {
	 tokenval = 0;
	 rc = DONE_TOK;
	 break;
      }
      else {
	 tokenval = 0;
	 rc = t;
	 break;
      }
   }
   return rc;
}